

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O3

string * duckdb::TemplatedDecimalToString<long>
                   (string *__return_storage_ptr__,long value,uint8_t width,uint8_t scale)

{
  uint uVar1;
  char *dst;
  
  uVar1 = DecimalToString::DecimalLength<long>(value,width,scale);
  dst = (char *)operator_new__((long)(int)(uVar1 + 1));
  DecimalToString::FormatDecimal<long>(value,width,scale,dst,(long)(int)uVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,dst,dst + uVar1);
  operator_delete__(dst);
  return __return_storage_ptr__;
}

Assistant:

string TemplatedDecimalToString(SIGNED value, uint8_t width, uint8_t scale) {
	auto len = DecimalToString::DecimalLength<SIGNED>(value, width, scale);
	auto data = make_unsafe_uniq_array_uninitialized<char>(UnsafeNumericCast<size_t>(len + 1));
	DecimalToString::FormatDecimal<SIGNED>(value, width, scale, data.get(), UnsafeNumericCast<idx_t>(len));
	return string(data.get(), UnsafeNumericCast<uint32_t>(len));
}